

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

bcf_hrec_t * bcf_hdr_get_hrec(bcf_hdr_t *hdr,int type,char *key,char *value,char *str_class)

{
  bcf_hrec_t *pbVar1;
  kh_vdict_t *h;
  uint uVar2;
  int iVar3;
  uint uVar4;
  khint_t kVar5;
  ulong uVar6;
  
  if (type == 5) {
    uVar2 = hdr->nhrec;
    if (hdr->nhrec < 1) {
      uVar2 = 0;
    }
    for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
      pbVar1 = hdr->hrec[uVar6];
      if ((pbVar1->type == 5) && (iVar3 = strcmp(pbVar1->key,key), iVar3 == 0)) {
        if (value == (char *)0x0) {
          return pbVar1;
        }
        iVar3 = strcmp(pbVar1->value,value);
        if (iVar3 == 0) {
          return pbVar1;
        }
      }
    }
  }
  else {
    if (type != 4) {
      h = (kh_vdict_t *)hdr->dict[type == 3];
      kVar5 = kh_get_vdict(h,value);
      if (kVar5 == h->n_buckets) {
        return (bcf_hrec_t *)0x0;
      }
      iVar3 = 0;
      if (type != 3) {
        iVar3 = type;
      }
      return h->vals[kVar5].hrec[iVar3];
    }
    uVar2 = hdr->nhrec;
    if (hdr->nhrec < 1) {
      uVar2 = 0;
    }
    for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
      pbVar1 = hdr->hrec[uVar6];
      if ((((pbVar1->type == 4) && (iVar3 = strcmp(pbVar1->key,str_class), iVar3 == 0)) &&
          (uVar4 = bcf_hrec_find_key(pbVar1,key), -1 < (int)uVar4)) &&
         (iVar3 = strcmp(pbVar1->vals[uVar4],value), iVar3 == 0)) {
        return pbVar1;
      }
    }
  }
  return (bcf_hrec_t *)0x0;
}

Assistant:

bcf_hrec_t *bcf_hdr_get_hrec(const bcf_hdr_t *hdr, int type, const char *key, const char *value, const char *str_class)
{
    int i;
    if ( type==BCF_HL_GEN )
    {
        for (i=0; i<hdr->nhrec; i++)
        {
            if ( hdr->hrec[i]->type!=type ) continue;
            if ( strcmp(hdr->hrec[i]->key,key) ) continue;
            if ( !value || !strcmp(hdr->hrec[i]->value,value) ) return hdr->hrec[i];
        }
        return NULL;
    }
    else if ( type==BCF_HL_STR )
    {
        for (i=0; i<hdr->nhrec; i++)
        {
            if ( hdr->hrec[i]->type!=type ) continue;
            if ( strcmp(hdr->hrec[i]->key,str_class) ) continue;
            int j = bcf_hrec_find_key(hdr->hrec[i],key);
            if ( j>=0 && !strcmp(hdr->hrec[i]->vals[j],value) ) return hdr->hrec[i];
        }
        return NULL;
    }
    vdict_t *d = type==BCF_HL_CTG ? (vdict_t*)hdr->dict[BCF_DT_CTG] : (vdict_t*)hdr->dict[BCF_DT_ID];
    khint_t k = kh_get(vdict, d, value);
    if ( k == kh_end(d) ) return NULL;
    return kh_val(d, k).hrec[type==BCF_HL_CTG?0:type];
}